

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall bloom_tests::rolling_bloom::test_method(rolling_bloom *this)

{
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  Span<const_unsigned_char> vKey_02;
  Span<const_unsigned_char> vKey_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  Span<const_unsigned_char> vKey_06;
  Span<const_unsigned_char> vKey_07;
  Span<const_unsigned_char> vKey_08;
  Span<const_unsigned_char> vKey_09;
  Span<const_unsigned_char> vKey_10;
  Span<const_unsigned_char> vKey_11;
  bool bVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd348;
  lazy_ostream *in_stack_ffffffffffffd350;
  char *in_stack_ffffffffffffd358;
  SeedRand in_stack_ffffffffffffd364;
  BasicTestingSetup *in_stack_ffffffffffffd368;
  CRollingBloomFilter *in_stack_ffffffffffffd370;
  size_t in_stack_ffffffffffffd378;
  const_string *in_stack_ffffffffffffd380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  BloomTest *in_stack_ffffffffffffd388;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  undefined8 in_stack_ffffffffffffd390;
  undefined7 in_stack_ffffffffffffd398;
  undefined1 in_stack_ffffffffffffd39f;
  undefined7 in_stack_ffffffffffffd3a8;
  undefined1 in_stack_ffffffffffffd3af;
  undefined8 in_stack_ffffffffffffd3b0;
  undefined7 in_stack_ffffffffffffd3b8;
  undefined1 in_stack_ffffffffffffd3bf;
  undefined6 in_stack_ffffffffffffd3d0;
  undefined1 in_stack_ffffffffffffd3d6;
  undefined1 in_stack_ffffffffffffd3d7;
  lazy_ostream *in_stack_ffffffffffffd3d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2b38;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  rolling_bloom *this_local;
  const_string local_2af0 [2];
  lazy_ostream local_2ad0 [3];
  assertion_result local_2aa0 [3];
  CRollingBloomFilter rb2;
  lazy_ostream local_2a24;
  undefined1 local_2a10 [80];
  const_string local_29c0 [2];
  lazy_ostream local_29a0 [3];
  assertion_result local_2970 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> d;
  const_string local_2910 [2];
  lazy_ostream local_28f0 [3];
  assertion_result local_28c0 [3];
  const_string local_2878 [2];
  lazy_ostream local_2858 [3];
  assertion_result local_2828 [2];
  const_string local_27f0 [2];
  lazy_ostream local_27d0 [3];
  assertion_result local_27a0 [2];
  const_string local_2768 [2];
  lazy_ostream local_2748 [3];
  assertion_result local_2718 [2];
  lazy_ostream local_26dc;
  undefined1 local_26c8 [108];
  uint nHits;
  const_string local_2658 [2];
  lazy_ostream local_2638 [3];
  assertion_result local_2608 [4];
  CRollingBloomFilter rb1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data [399];
  pointer local_8;
  
  data[0xe5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data[0x3a].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(in_stack_ffffffffffffd368,in_stack_ffffffffffffd364);
  CRollingBloomFilter::CRollingBloomFilter
            ((CRollingBloomFilter *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8),
             (uint)((ulong)in_stack_ffffffffffffd3b0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffd3af,in_stack_ffffffffffffd3a8));
  local_2b38 = data;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd348);
    local_2b38 = local_2b38 + 1;
  } while (local_2b38 !=
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffff0);
  for (i = 0; i < 399; i = i + 1) {
    BloomTest::RandomData(in_stack_ffffffffffffd388);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd358);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_08.m_data._6_1_ = in_stack_ffffffffffffd3d6;
    vKey_08.m_data._0_6_ = in_stack_ffffffffffffd3d0;
    vKey_08.m_data._7_1_ = in_stack_ffffffffffffd3d7;
    vKey_08.m_size = (size_t)in_stack_ffffffffffffd3d8;
    CRollingBloomFilter::insert
              ((CRollingBloomFilter *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8),
               vKey_08);
  }
  for (i_1 = 299; i_1 < 399; i_1 = i_1 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
                 in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
                 in_stack_ffffffffffffd348);
      vKey.m_size._0_7_ = in_stack_ffffffffffffd398;
      vKey.m_data = (uchar *)in_stack_ffffffffffffd390;
      vKey.m_size._7_1_ = in_stack_ffffffffffffd39f;
      CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd348 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2608,local_2638,local_2658,0x1e0,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffd348);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd348);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  nHits = 0;
  for (i_2 = 0; i_2 < 10000; i_2 = i_2 + 1) {
    BloomTest::RandomData(in_stack_ffffffffffffd388);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_00.m_size._0_7_ = in_stack_ffffffffffffd398;
    vKey_00.m_data = (uchar *)in_stack_ffffffffffffd390;
    vKey_00.m_size._7_1_ = in_stack_ffffffffffffd39f;
    bVar1 = CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd358);
    if (bVar1) {
      nHits = nHits + 1;
    }
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
               in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd350,(char (*) [1])in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    local_26dc._vptr_lazy_ostream._0_4_ = 0x47;
    in_stack_ffffffffffffd358 = "71U";
    in_stack_ffffffffffffd350 = &local_26dc;
    in_stack_ffffffffffffd348 = "nHits";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_26c8,(undefined1 *)((long)&local_26dc._vptr_lazy_ostream + 4),0x1ed,1,2,&nHits)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd348);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
               in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_01.m_size._0_7_ = in_stack_ffffffffffffd398;
    vKey_01.m_data = (uchar *)in_stack_ffffffffffffd390;
    vKey_01.m_size._7_1_ = in_stack_ffffffffffffd39f;
    CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd358,
               SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    in_stack_ffffffffffffd348 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2718,local_2748,local_2768,0x1ef,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd348);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd348);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CRollingBloomFilter::reset((CRollingBloomFilter *)in_stack_ffffffffffffd368);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
               in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_02.m_size._0_7_ = in_stack_ffffffffffffd398;
    vKey_02.m_data = (uchar *)in_stack_ffffffffffffd390;
    vKey_02.m_size._7_1_ = in_stack_ffffffffffffd39f;
    CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd358,
               SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    in_stack_ffffffffffffd348 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_27a0,local_27d0,local_27f0,0x1f1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd348);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd348);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (i_3 = 0; i_3 < 399; i_3 = i_3 + 1) {
    if (99 < i_3) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                   (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
                   in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffd350,in_stack_ffffffffffffd348);
        vKey_03.m_size._0_7_ = in_stack_ffffffffffffd398;
        vKey_03.m_data = (uchar *)in_stack_ffffffffffffd390;
        vKey_03.m_size._7_1_ = in_stack_ffffffffffffd39f;
        CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_03);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffd358,
                   SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                   (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                   (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
        in_stack_ffffffffffffd348 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2828,local_2858,local_2878,0x1f7,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffd348);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffd348);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_09.m_data._6_1_ = in_stack_ffffffffffffd3d6;
    vKey_09.m_data._0_6_ = in_stack_ffffffffffffd3d0;
    vKey_09.m_data._7_1_ = in_stack_ffffffffffffd3d7;
    vKey_09.m_size = (size_t)in_stack_ffffffffffffd3d8;
    CRollingBloomFilter::insert
              ((CRollingBloomFilter *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8),
               vKey_09);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
                 in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
                 in_stack_ffffffffffffd348);
      vKey_04.m_size._0_7_ = in_stack_ffffffffffffd398;
      vKey_04.m_data = (uchar *)in_stack_ffffffffffffd390;
      vKey_04.m_size._7_1_ = in_stack_ffffffffffffd39f;
      CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_04);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd348 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_28c0,local_28f0,local_2910,0x1f9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffd348);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd348);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (i_4 = 0; i_4 < 999; i_4 = i_4 + 1) {
    BloomTest::RandomData(in_stack_ffffffffffffd388);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_10.m_data._6_1_ = in_stack_ffffffffffffd3d6;
    vKey_10.m_data._0_6_ = in_stack_ffffffffffffd3d0;
    vKey_10.m_data._7_1_ = in_stack_ffffffffffffd3d7;
    vKey_10.m_size = (size_t)in_stack_ffffffffffffd3d8;
    CRollingBloomFilter::insert
              ((CRollingBloomFilter *)CONCAT17(in_stack_ffffffffffffd3bf,in_stack_ffffffffffffd3b8),
               vKey_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
                 in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
                 in_stack_ffffffffffffd348);
      vKey_05.m_size._0_7_ = in_stack_ffffffffffffd398;
      vKey_05.m_data = (uchar *)in_stack_ffffffffffffd390;
      vKey_05.m_size._7_1_ = in_stack_ffffffffffffd39f;
      CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_05);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      in_stack_ffffffffffffd3d8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd348 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2970,local_29a0,local_29c0,0x200,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffd348);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd3d7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffd3d7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd358);
  }
  nHits = 0;
  for (i_5 = 0; i_5 < 399; i_5 = i_5 + 1) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_06.m_size._0_7_ = in_stack_ffffffffffffd398;
    vKey_06.m_data = (uchar *)in_stack_ffffffffffffd390;
    vKey_06.m_size._7_1_ = in_stack_ffffffffffffd39f;
    in_stack_ffffffffffffd3d6 = CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_06);
    if ((bool)in_stack_ffffffffffffd3d6) {
      nHits = nHits + 1;
    }
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
               in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffd350,(char (*) [1])in_stack_ffffffffffffd348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
               (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
    local_2a24._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffd358 = "3U";
    in_stack_ffffffffffffd350 = &local_2a24;
    in_stack_ffffffffffffd348 = "nHits";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_2a10,(undefined1 *)((long)&local_2a24._vptr_lazy_ostream + 4),0x209,1,2,&nHits)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd348);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  CRollingBloomFilter::CRollingBloomFilter
            ((CRollingBloomFilter *)CONCAT17(uVar2,in_stack_ffffffffffffd3b8),
             (uint)((ulong)in_stack_ffffffffffffd3b0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffd3af,in_stack_ffffffffffffd3a8));
  for (i_6 = 0; i_6 < 399; i_6 = i_6 + 1) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
               in_stack_ffffffffffffd348);
    vKey_11.m_data._6_1_ = in_stack_ffffffffffffd3d6;
    vKey_11.m_data._0_6_ = in_stack_ffffffffffffd3d0;
    vKey_11.m_data._7_1_ = in_stack_ffffffffffffd3d7;
    vKey_11.m_size = (size_t)in_stack_ffffffffffffd3d8;
    CRollingBloomFilter::insert
              ((CRollingBloomFilter *)CONCAT17(uVar2,in_stack_ffffffffffffd3b8),vKey_11);
  }
  for (i_7 = 0; i_7 < 399; i_7 = i_7 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffd388,in_stack_ffffffffffffd380,
                 in_stack_ffffffffffffd378,(const_string *)in_stack_ffffffffffffd370);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffd358,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd350,
                 in_stack_ffffffffffffd348);
      vKey_07.m_size._0_7_ = in_stack_ffffffffffffd398;
      vKey_07.m_data = (uchar *)in_stack_ffffffffffffd390;
      vKey_07.m_size._7_1_ = in_stack_ffffffffffffd39f;
      CRollingBloomFilter::contains(in_stack_ffffffffffffd370,vKey_07);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffd350,(basic_cstring<const_char> *)in_stack_ffffffffffffd348);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd358,
                 (pointer)in_stack_ffffffffffffd350,(unsigned_long)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd348 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2aa0,local_2ad0,local_2af0,0x212,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffd348);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd348);
      in_stack_ffffffffffffd39f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffd39f);
  }
  CRollingBloomFilter::~CRollingBloomFilter((CRollingBloomFilter *)in_stack_ffffffffffffd348);
  pvVar4 = data;
  pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffff0;
  do {
    pvVar3 = pvVar3 + -1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd358);
  } while (pvVar3 != pvVar4);
  CRollingBloomFilter::~CRollingBloomFilter((CRollingBloomFilter *)in_stack_ffffffffffffd348);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rolling_bloom)
{
    SeedRandomForTest(SeedRand::ZEROS);

    // last-100-entry, 1% false positive:
    CRollingBloomFilter rb1(100, 0.01);

    // Overfill:
    static const int DATASIZE=399;
    std::vector<unsigned char> data[DATASIZE];
    for (int i = 0; i < DATASIZE; i++) {
        data[i] = RandomData();
        rb1.insert(data[i]);
    }
    // Last 100 guaranteed to be remembered:
    for (int i = 299; i < DATASIZE; i++) {
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // false positive rate is 1%, so we should get about 100 hits if
    // testing 10,000 random keys. We get worst-case false positive
    // behavior when the filter is as full as possible, which is
    // when we've inserted one minus an integer multiple of nElement*2.
    unsigned int nHits = 0;
    for (int i = 0; i < 10000; i++) {
        if (rb1.contains(RandomData()))
            ++nHits;
    }
    // Expect about 100 hits
    BOOST_CHECK_EQUAL(nHits, 71U);

    BOOST_CHECK(rb1.contains(data[DATASIZE-1]));
    rb1.reset();
    BOOST_CHECK(!rb1.contains(data[DATASIZE-1]));

    // Now roll through data, make sure last 100 entries
    // are always remembered:
    for (int i = 0; i < DATASIZE; i++) {
        if (i >= 100)
            BOOST_CHECK(rb1.contains(data[i-100]));
        rb1.insert(data[i]);
        BOOST_CHECK(rb1.contains(data[i]));
    }

    // Insert 999 more random entries:
    for (int i = 0; i < 999; i++) {
        std::vector<unsigned char> d = RandomData();
        rb1.insert(d);
        BOOST_CHECK(rb1.contains(d));
    }
    // Sanity check to make sure the filter isn't just filling up:
    nHits = 0;
    for (int i = 0; i < DATASIZE; i++) {
        if (rb1.contains(data[i]))
            ++nHits;
    }
    // Expect about 5 false positives
    BOOST_CHECK_EQUAL(nHits, 3U);

    // last-1000-entry, 0.01% false positive:
    CRollingBloomFilter rb2(1000, 0.001);
    for (int i = 0; i < DATASIZE; i++) {
        rb2.insert(data[i]);
    }
    // ... room for all of them:
    for (int i = 0; i < DATASIZE; i++) {
        BOOST_CHECK(rb2.contains(data[i]));
    }
}